

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS2fstreamMPI.cpp
# Opt level: O0

int __thiscall adios2::fstream::open(fstream *this,char *__file,int __oflag,...)

{
  undefined4 uVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  char (*in_stack_ffffffffffffffb8) [4];
  undefined4 in_stack_ffffffffffffffc0;
  Comm *in_stack_ffffffffffffffc8;
  Mode *in_stack_ffffffffffffffd0;
  
  adios2::fstream::CheckOpen((string *)this);
  uVar1 = adios2::fstream::ToMode((openmode)this);
  adios2::helper::CommDupMPI((ompi_communicator_t *)&stack0xffffffffffffffb8);
  std::
  make_shared<adios2::core::Stream,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,std::__cxx11::string_const&,char_const(&)[4]>
            (in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(uVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
  std::shared_ptr<adios2::core::Stream>::operator=
            ((shared_ptr<adios2::core::Stream> *)__file,&this->m_Stream);
  std::shared_ptr<adios2::core::Stream>::~shared_ptr((shared_ptr<adios2::core::Stream> *)0x10ab22);
  iVar2 = adios2::helper::Comm::~Comm((Comm *)&stack0xffffffffffffffb8);
  return iVar2;
}

Assistant:

void fstream::open(const std::string &name, const openmode mode, MPI_Comm comm,
                   const std::string engineType)
{
    CheckOpen(name);
    m_Stream = std::make_shared<core::Stream>(name, ToMode(mode), helper::CommDupMPI(comm),
                                              engineType, "C++");
}